

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::BufferID>::emplaceRealloc<slang::BufferID>
          (SmallVectorBase<slang::BufferID> *this,pointer pos,BufferID *args)

{
  ulong uVar1;
  pointer __ptr;
  pointer pBVar2;
  size_type sVar3;
  pointer pBVar4;
  uint32_t *puVar5;
  pointer pBVar6;
  long lVar7;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar7 = (long)pos - (long)this->data_;
  pBVar2 = (pointer)detail::allocArray(capacity,4);
  *(uint32_t *)((long)pBVar2 + lVar7) = args->id;
  __ptr = this->data_;
  sVar3 = this->len;
  pBVar4 = __ptr;
  pBVar6 = pBVar2;
  if (__ptr + sVar3 == pos) {
    pBVar4 = pBVar2;
    pBVar6 = __ptr;
    if (sVar3 != 0) {
      do {
        pBVar4->id = pBVar6->id;
        pBVar6 = pBVar6 + 1;
        pBVar4 = pBVar4 + 1;
      } while (pBVar6 != pos);
    }
  }
  else {
    for (; pBVar4 != pos; pBVar4 = pBVar4 + 1) {
      pBVar6->id = pBVar4->id;
      pBVar6 = pBVar6 + 1;
    }
    puVar5 = (uint32_t *)((long)pBVar2 + lVar7);
    do {
      puVar5 = puVar5 + 1;
      *puVar5 = pos->id;
      pos = pos + 1;
    } while (pos != __ptr + sVar3);
  }
  if (__ptr != (pointer)this->firstElement) {
    free(__ptr);
    sVar3 = this->len;
  }
  this->len = sVar3 + 1;
  this->cap = capacity;
  this->data_ = pBVar2;
  return (pointer)((long)pBVar2 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}